

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Joint::unkeyframe(Joint *this,double t)

{
  _Rb_tree_header *p_Var1;
  pointer ppJVar2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  pointer ppJVar8;
  double dVar9;
  double dVar10;
  
  if ((this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      0) {
    p_Var6 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    p_Var1 = &(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    if (p_Var6 == (_Base_ptr)0x0) {
      iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
      p_Var7 = iVar5._M_node;
    }
    else {
      do {
        bVar3 = t != *(double *)(p_Var6 + 1);
        bVar4 = *(double *)(p_Var6 + 1) <= t;
        if (!bVar4 || !bVar3) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[bVar4 && bVar3];
      } while (p_Var6 != (_Base_ptr)0x0);
      iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var7);
      if ((_Rb_tree_header *)p_Var7 == p_Var1) {
        p_Var7 = iVar5._M_node;
      }
    }
    dVar9 = ABS(*(double *)(iVar5._M_node + 1) - t);
    dVar10 = ABS(*(double *)(p_Var7 + 1) - t);
    if (((dVar9 < 0.1) && (dVar9 < dVar10)) ||
       ((dVar10 < 0.1 && (iVar5._M_node = p_Var7, dVar10 < dVar9)))) {
      std::
      _Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
                          *)&(this->super_SceneObject).positions,iVar5);
    }
  }
  if ((this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      0) {
    p_Var6 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    p_Var1 = &(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    if (p_Var6 == (_Base_ptr)0x0) {
      iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
      p_Var7 = iVar5._M_node;
    }
    else {
      do {
        bVar3 = t != *(double *)(p_Var6 + 1);
        bVar4 = *(double *)(p_Var6 + 1) <= t;
        if (!bVar4 || !bVar3) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[bVar4 && bVar3];
      } while (p_Var6 != (_Base_ptr)0x0);
      iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var7);
      if ((_Rb_tree_header *)p_Var7 == p_Var1) {
        p_Var7 = iVar5._M_node;
      }
    }
    dVar9 = ABS(*(double *)(iVar5._M_node + 1) - t);
    dVar10 = ABS(*(double *)(p_Var7 + 1) - t);
    if (((dVar9 < 0.1) && (dVar9 < dVar10)) ||
       ((dVar10 < 0.1 && (iVar5._M_node = p_Var7, dVar10 < dVar9)))) {
      std::
      _Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
                          *)&(this->super_SceneObject).rotations,iVar5);
    }
  }
  if ((this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
  {
    p_Var6 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    p_Var1 = &(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    if (p_Var6 == (_Base_ptr)0x0) {
      iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
      p_Var7 = iVar5._M_node;
    }
    else {
      do {
        bVar3 = t != *(double *)(p_Var6 + 1);
        bVar4 = *(double *)(p_Var6 + 1) <= t;
        if (!bVar4 || !bVar3) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[bVar4 && bVar3];
      } while (p_Var6 != (_Base_ptr)0x0);
      iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var7);
      if ((_Rb_tree_header *)p_Var7 == p_Var1) {
        p_Var7 = iVar5._M_node;
      }
    }
    dVar9 = ABS(*(double *)(iVar5._M_node + 1) - t);
    dVar10 = ABS(*(double *)(p_Var7 + 1) - t);
    if (((dVar9 < 0.1) && (dVar9 < dVar10)) ||
       ((dVar10 < 0.1 && (iVar5._M_node = p_Var7, dVar10 < dVar9)))) {
      std::
      _Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
                          *)&(this->super_SceneObject).scales,iVar5);
    }
  }
  ppJVar2 = (this->kids).
            super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar8 = (this->kids).
                 super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppJVar8 != ppJVar2;
      ppJVar8 = ppJVar8 + 1) {
    unkeyframe(*ppJVar8,t);
  }
  return;
}

Assistant:

void Joint::unkeyframe(double t) {
     positions.removeKnot(t, 0.1);
     rotations.removeKnot(t, 0.1);
     scales.removeKnot(t, 0.1);
     for (Joint *j : kids) j->unkeyframe(t);
   }